

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_mtree.c
# Opt level: O2

wchar_t bid_keycmp(char *p,char *key,ssize_t len)

{
  byte bVar1;
  wchar_t wVar2;
  long lVar3;
  
  for (lVar3 = 0; (0 < len && (bVar1 = p[lVar3], bVar1 != 0)); lVar3 = lVar3 + 1) {
    if (key[lVar3] == 0) goto LAB_00129566;
    if (bVar1 != key[lVar3]) {
      return L'\0';
    }
    len = len + -1;
  }
  if (key[lVar3] != '\0') {
    return L'\0';
  }
  bVar1 = p[lVar3];
LAB_00129566:
  if (((bVar1 < 0x3e) && ((0x2000000100002600U >> ((ulong)bVar1 & 0x3f) & 1) != 0)) ||
     ((wVar2 = L'\0', bVar1 == 0x5c && ((p[lVar3 + 1] == '\r' || (p[lVar3 + 1] == '\n')))))) {
    wVar2 = (wchar_t)lVar3;
  }
  return wVar2;
}

Assistant:

static int
bid_keycmp(const char *p, const char *key, ssize_t len)
{
	int match_len = 0;

	while (len > 0 && *p && *key) {
		if (*p == *key) {
			--len;
			++p;
			++key;
			++match_len;
			continue;
		}
		return (0);/* Not match */
	}
	if (*key != '\0')
		return (0);/* Not match */

	/* A following character should be specified characters */
	if (p[0] == '=' || p[0] == ' ' || p[0] == '\t' ||
	    p[0] == '\n' || p[0] == '\r' ||
	   (p[0] == '\\' && (p[1] == '\n' || p[1] == '\r')))
		return (match_len);
	return (0);/* Not match */
}